

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sound.cpp
# Opt level: O3

char * XPMPSoundAdd(char *sName,char *filePath,bool bLoop,float coneDir,float conePitch,
                   float coneInAngle,float coneOutAngle,float coneOutVol)

{
  long *plVar1;
  bool bVar2;
  char cVar3;
  char *pcVar4;
  allocator<char> local_7e;
  allocator<char> local_7d;
  float local_7c;
  float local_78;
  float local_74;
  float local_70;
  float local_6c;
  string local_68;
  long *local_48 [2];
  long local_38 [2];
  
  local_7c = coneDir;
  local_78 = conePitch;
  local_74 = coneInAngle;
  local_70 = coneOutAngle;
  local_6c = coneOutVol;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,filePath,(allocator<char> *)local_48);
  bVar2 = XPMP2::ExistsFile(&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  plVar1 = XPMP2::gpSndSys;
  if (bVar2) {
    if (XPMP2::gpSndSys == (long *)0x0) {
      pcVar4 = "No sound system available";
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,sName,&local_7d);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_48,filePath,&local_7e);
      cVar3 = (**(code **)(*plVar1 + 0x10))
                        (local_7c,local_78,local_74,local_70,local_6c,plVar1,&local_68,local_48,
                         bLoop);
      if (local_48[0] != local_38) {
        operator_delete(local_48[0],local_38[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      pcVar4 = "Failed loading the sound file";
      if (cVar3 != '\0') {
        pcVar4 = "";
      }
    }
  }
  else {
    pcVar4 = "Sound File not found";
    if (XPMP2::glob < 4) {
      XPMP2::LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/Sound.cpp"
                    ,0x45a,"XPMPSoundAdd",logERR,"Sound file not found: %s",filePath);
    }
  }
  return pcVar4;
}

Assistant:

const char* XPMPSoundAdd (const char* sName,
                          const char* filePath,
                          bool bLoop,
                          float coneDir, float conePitch,
                          float coneInAngle, float coneOutAngle,
                          float coneOutVol)
{
    // Test file existence first before bothering
    if (!XPMP2::ExistsFile(filePath)) {
        LOG_MSG(XPMP2::logERR, "Sound file not found: %s", filePath)
        return "Sound File not found";
    }
    // No sound system yet available?
    if (!XPMP2::gpSndSys)
        return "No sound system available";
    // Load the sound and add it to the map
    if (!XPMP2::gpSndSys->LoadSoundFile(sName, filePath, bLoop,
                                       coneDir, conePitch, coneInAngle,
                                       coneOutAngle, coneOutVol))
        return "Failed loading the sound file";
    
    // All good
    return "";
}